

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TimerQueue.cpp
# Opt level: O2

void mario::detail::readTimerfd(int timerfd)

{
  Writer *pWVar1;
  ssize_t n;
  uint64_t howmany;
  Writer local_80;
  
  n = read(timerfd,&howmany,8);
  if (n != 8) {
    local_80._vptr_Writer = (_func_int **)&PTR__Writer_0012bdc0;
    local_80.m_msg = (LogMessage *)0x0;
    local_80.m_level = Fatal;
    local_80.m_file =
         "/workspace/llm4binary/github/license_all_cmakelists_25/yichenluan[P]Mario/mario/net/TimerQueue.cpp"
    ;
    local_80.m_line = 0x30;
    local_80.m_func = "void mario::detail::readTimerfd(int)";
    local_80.m_verboseLevel = 0;
    local_80.m_logger = (Logger *)0x0;
    local_80.m_proceed = false;
    local_80.m_messageBuilder.m_logger = (Logger *)0x0;
    local_80.m_messageBuilder.m_containerLogSeperator = "";
    local_80.m_dispatchAction = NormalLog;
    local_80.m_loggerIds.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_80.m_loggerIds.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_80.m_loggerIds.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    pWVar1 = el::base::Writer::construct(&local_80,1,"default");
    pWVar1 = el::base::Writer::operator<<(pWVar1,(char (*) [32])"TimerQueue::handleRead() reads ");
    pWVar1 = el::base::Writer::operator<<(pWVar1,&n);
    el::base::Writer::operator<<(pWVar1,(char (*) [20])" bytes instead of 8");
    el::base::Writer::~Writer(&local_80);
  }
  return;
}

Assistant:

void readTimerfd(int timerfd) {
    uint64_t howmany;
    ssize_t n = ::read(timerfd, &howmany, sizeof(howmany));

    //LOG(INFO) << "TimerQueue::handleRead() " << howmany;

    if (n != sizeof(howmany)) {
        LOG(FATAL) << "TimerQueue::handleRead() reads " << n << " bytes instead of 8";
    }
}